

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

uint8 * __thiscall
google::protobuf::UninterpretedOption::SerializeWithCachedSizesToArray
          (UninterpretedOption *this,uint8 *target)

{
  UninterpretedOption_NamePart *this_00;
  string *psVar1;
  uint64 uVar2;
  double dVar3;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar4;
  uint uVar5;
  uint32 uVar6;
  long lVar7;
  uint8 *puVar8;
  
  if (0 < (this->name_).super_RepeatedPtrFieldBase.current_size_) {
    lVar7 = 0;
    do {
      this_00 = (UninterpretedOption_NamePart *)
                (this->name_).super_RepeatedPtrFieldBase.elements_[lVar7];
      *target = '\x12';
      uVar5 = this_00->_cached_size_;
      if (uVar5 < 0x80) {
        target[1] = (uint8)uVar5;
        puVar8 = target + 2;
      }
      else {
        puVar8 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar5,target + 1);
      }
      target = UninterpretedOption_NamePart::SerializeWithCachedSizesToArray(this_00,puVar8);
      lVar7 = lVar7 + 1;
    } while (lVar7 < (this->name_).super_RepeatedPtrFieldBase.current_size_);
  }
  uVar5 = this->_has_bits_[0];
  if ((uVar5 & 2) != 0) {
    internal::WireFormat::VerifyUTF8StringFallback
              ((this->identifier_value_->_M_dataplus)._M_p,
               (int)this->identifier_value_->_M_string_length,SERIALIZE);
    psVar1 = this->identifier_value_;
    *target = '\x1a';
    uVar6 = (uint32)psVar1->_M_string_length;
    if (uVar6 < 0x80) {
      target[1] = (uint8)psVar1->_M_string_length;
      puVar8 = target + 2;
    }
    else {
      puVar8 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar6,target + 1);
    }
    target = io::CodedOutputStream::WriteRawToArray
                       ((psVar1->_M_dataplus)._M_p,(int)psVar1->_M_string_length,puVar8);
    uVar5 = this->_has_bits_[0];
  }
  if ((uVar5 & 4) != 0) {
    uVar2 = this->positive_int_value_;
    *target = ' ';
    target = io::CodedOutputStream::WriteVarint64ToArray(uVar2,target + 1);
    uVar5 = this->_has_bits_[0];
  }
  if ((uVar5 & 8) != 0) {
    uVar2 = this->negative_int_value_;
    *target = '(';
    target = io::CodedOutputStream::WriteVarint64ToArray(uVar2,target + 1);
    uVar5 = this->_has_bits_[0];
  }
  if ((uVar5 & 0x10) != 0) {
    dVar3 = this->double_value_;
    *target = '1';
    *(double *)(target + 1) = dVar3;
    target = target + 9;
    uVar5 = this->_has_bits_[0];
  }
  if ((uVar5 & 0x20) != 0) {
    psVar1 = this->string_value_;
    *target = ':';
    uVar6 = (uint32)psVar1->_M_string_length;
    if (uVar6 < 0x80) {
      target[1] = (uint8)psVar1->_M_string_length;
      puVar8 = target + 2;
    }
    else {
      puVar8 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar6,target + 1);
    }
    target = io::CodedOutputStream::WriteRawToArray
                       ((psVar1->_M_dataplus)._M_p,(int)psVar1->_M_string_length,puVar8);
    uVar5 = this->_has_bits_[0];
  }
  if ((uVar5 & 0x40) != 0) {
    internal::WireFormat::VerifyUTF8StringFallback
              ((this->aggregate_value_->_M_dataplus)._M_p,
               (int)this->aggregate_value_->_M_string_length,SERIALIZE);
    psVar1 = this->aggregate_value_;
    *target = 'B';
    uVar6 = (uint32)psVar1->_M_string_length;
    if (uVar6 < 0x80) {
      target[1] = (uint8)psVar1->_M_string_length;
      puVar8 = target + 2;
    }
    else {
      puVar8 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar6,target + 1);
    }
    target = io::CodedOutputStream::WriteRawToArray
                       ((psVar1->_M_dataplus)._M_p,(int)psVar1->_M_string_length,puVar8);
  }
  pvVar4 = (this->_unknown_fields_).fields_;
  if ((pvVar4 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     ((pvVar4->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar4->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    puVar8 = internal::WireFormat::SerializeUnknownFieldsToArray(&this->_unknown_fields_,target);
    return puVar8;
  }
  return target;
}

Assistant:

::google::protobuf::uint8* UninterpretedOption::SerializeWithCachedSizesToArray(
    ::google::protobuf::uint8* target) const {
  // repeated .google.protobuf.UninterpretedOption.NamePart name = 2;
  for (int i = 0; i < this->name_size(); i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        2, this->name(i), target);
  }

  // optional string identifier_value = 3;
  if (has_identifier_value()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->identifier_value().data(), this->identifier_value().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        3, this->identifier_value(), target);
  }

  // optional uint64 positive_int_value = 4;
  if (has_positive_int_value()) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt64ToArray(4, this->positive_int_value(), target);
  }

  // optional int64 negative_int_value = 5;
  if (has_negative_int_value()) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt64ToArray(5, this->negative_int_value(), target);
  }

  // optional double double_value = 6;
  if (has_double_value()) {
    target = ::google::protobuf::internal::WireFormatLite::WriteDoubleToArray(6, this->double_value(), target);
  }

  // optional bytes string_value = 7;
  if (has_string_value()) {
    target =
      ::google::protobuf::internal::WireFormatLite::WriteBytesToArray(
        7, this->string_value(), target);
  }

  // optional string aggregate_value = 8;
  if (has_aggregate_value()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->aggregate_value().data(), this->aggregate_value().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        8, this->aggregate_value(), target);
  }

  if (!unknown_fields().empty()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  return target;
}